

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O1

string * __thiscall Screen::getInput_abi_cxx11_(string *__return_storage_ptr__,Screen *this)

{
  size_t sVar1;
  char inputText [100];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  char local_88 [104];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88[0] = '\0';
  wclear(this->inputScreen);
  wrefresh(this->inputScreen);
  mvwprintw(this->inputScreen,1,1,"> ");
  wgetnstr(this->inputScreen,local_88,0xffffffff);
  local_a8[0] = local_98;
  sVar1 = strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,local_88,local_88 + sVar1);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::getInput() {
    std::string formattedInput;
    char inputText[MAX_INPUT_LENGTH];
    inputText[0] = '\0';

    // Clear the input area
    clearWindow(inputScreen);
    wrefresh(inputScreen);

    // Move the cursor to the correct location
    mvwprintw(inputScreen, 1, 1, "> ");

    // Get a string of console input
    wgetstr(inputScreen, inputText);

    formattedInput = std::string(inputText);

    return formattedInput;
}